

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapSwampRiver(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t ss;
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  iVar2 = (*l->p->getMap)(l->p,out,x,z,w,h);
  if (iVar2 == 0) {
    ss = l->startSeed;
    lVar4 = (long)w;
    lVar9 = 0;
    if (0 < lVar4) {
      lVar9 = lVar4;
    }
    uVar6 = (ulong)(uint)h;
    if (h < 1) {
      uVar6 = 0;
    }
    for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
        uVar8 = out[lVar7];
        if ((uVar8 < 0x17) && ((0x600040U >> (uVar8 & 0x1f) & 1) != 0)) {
          uVar3 = getChunkSeed(ss,x + (int)lVar7,(int)uVar5 + z);
          auVar1._8_8_ = (long)uVar3 >> 0x3f;
          auVar1._0_8_ = (long)uVar3 >> 0x18;
          if (SUB168(auVar1 % SEXT816((long)((ulong)(uVar8 != 6) * 2 + 6)),0) == 0) {
            uVar8 = 7;
          }
          out[lVar7] = uVar8;
        }
      }
      out = out + lVar4;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapSwampRiver(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v = out[i + j*w];
            if (v != swamp && v != jungle && v != jungle_hills)
                continue;

            cs = getChunkSeed(ss, i + x, j + z);
            if (mcFirstIsZero(cs, (v == swamp) ? 6 : 8))
                v = river;

            out[i + j*w] = v;
        }
    }

    return 0;
}